

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blobs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *l;
  Options *out;
  Options *__s;
  Options *help_00;
  char **in_stack_00000070;
  int in_stack_0000007c;
  Options *in_stack_00000080;
  Options ops;
  string log_level;
  bool help;
  Session session;
  communicator world;
  environment env;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  allocator<char> *var;
  allocator<char> *in_stack_fffffffffffffbe0;
  string *l_00;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Options *ops_00;
  string *help_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_00;
  char s;
  string local_3d0 [48];
  undefined4 local_3a0;
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [47];
  allocator<char> local_341;
  string local_340 [39];
  undefined1 local_319 [48];
  undefined1 local_2e9 [40];
  undefined1 local_2c1 [48];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [24];
  Session *in_stack_fffffffffffffdb0;
  undefined1 local_201 [40];
  byte local_1d9;
  int local_1d8;
  int local_1d4 [105];
  communicator local_30;
  int local_4;
  
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffbac,(char **)0x14c68d);
  diy::mpi::communicator::communicator
            ((communicator *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  Catch::Session::Session(in_stack_fffffffffffffdb0);
  iVar2 = diy::mpi::communicator::size(&local_30);
  local_1d8 = 2;
  local_1d4[0] = iVar2;
  l = (string *)Catch::clara::std::max<int>(local_1d4,&local_1d8);
  s = (char)((uint)iVar2 >> 0x18);
  BlobsFixture::nblocks = *(int *)l;
  var_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator((allocator<char> *)local_201);
  opts::Options::Options((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  help_01 = (string *)&local_269;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  opts::Option<int>(s,l,(int *)var_00,help_01);
  out = opts::Options::operator>>
                  ((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  ops_00 = (Options *)local_2c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  opts::Option<int>(s,l,(int *)var_00,help_01);
  __s = opts::Options::operator>>
                  ((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  l_00 = (string *)local_319;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l_00);
  var = &local_341;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l_00);
  opts::Option<std::__cxx11::string>(s,l,var_00,help_01);
  help_00 = opts::Options::operator>>
                      ((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)l_00);
  opts::Option<bool>((char)((ulong)__s >> 0x38),l_00,(bool *)var,(string *)help_00);
  opts::Options::operator>>
            ((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)(local_319 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_319);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string((string *)(local_2e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e9);
  std::__cxx11::string::~string((string *)(local_2c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2c1);
  Catch::clara::std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::
  ~unique_ptr((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  bVar1 = opts::Options::parse(in_stack_00000080,in_stack_0000007c,in_stack_00000070);
  if (((bVar1) && ((local_1d9 & 1) == 0)) ||
     (iVar2 = diy::mpi::communicator::rank(&local_30), iVar2 != 0)) {
    std::__cxx11::string::string(local_3d0,(string *)(local_201 + 1));
    diy::create_logger((string *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    Catch::clara::std::shared_ptr<diy::spd::logger>::~shared_ptr
              ((shared_ptr<diy::spd::logger> *)0x14cebe);
    std::__cxx11::string::~string(local_3d0);
    in_stack_fffffffffffffbb4 =
         Catch::Session::run((Session *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    local_4 = in_stack_fffffffffffffbb4;
  }
  else {
    opts::operator<<((ostream *)out,ops_00);
    local_4 = 1;
  }
  local_3a0 = 1;
  opts::Options::~Options((Options *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  std::__cxx11::string::~string((string *)(local_201 + 1));
  Catch::Session::~Session((Session *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0))
  ;
  diy::mpi::communicator::~communicator((communicator *)0x14cf4d);
  diy::mpi::environment::~environment((environment *)0x14cf5a);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator world;

  Catch::Session session;

  BlobsFixture::nblocks = (std::max)(world.size(), 2);
  bool help;

  std::string log_level   = "info";

  // get command line arguments
  using namespace opts;
  Options ops;
  ops >> Option('b', "blocks", BlobsFixture::nblocks, "number of blocks")
      >> Option('t', "thread", BlobsFixture::threads, "number of threads")
      >> Option('l', "log",    log_level,              "log level")
      >> Option('h', "help",   help,                   "show help");
  if (!ops.parse(argc,argv) || help)
  {
    if (world.rank() == 0)
    {
      std::cout << ops;
      return 1;
    }
  }

  diy::create_logger(log_level);

  return session.run();
}